

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3CodeDropTable(Parse *pParse,Table *pTab,int iDb,int isView)

{
  u16 *puVar1;
  int iVar2;
  sqlite3 *db;
  Db *pDVar3;
  Schema *pSVar4;
  char *pcVar5;
  Table *pTable;
  int iVar6;
  Vdbe *p;
  Trigger *pTrigger;
  Parse *pPVar7;
  Index *pIVar8;
  Schema **ppSVar9;
  int iVar10;
  int iVar11;
  int iTable;
  HashElem *pHVar12;
  
  db = pParse->db;
  pDVar3 = db->aDb;
  p = sqlite3GetVdbe(pParse);
  pPVar7 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar7 = pParse;
  }
  sqlite3CodeVerifySchema(pParse,iDb);
  pPVar7->writeMask = pPVar7->writeMask | 1 << ((byte)iDb & 0x1f);
  pPVar7->isMultiWrite = pPVar7->isMultiWrite | 1;
  if (pTab->nModuleArg != 0) {
    sqlite3VdbeAddOp3(p,0xa0,0,0,0);
  }
  for (pTrigger = sqlite3TriggerList(pParse,pTab); pTrigger != (Trigger *)0x0;
      pTrigger = pTrigger->pNext) {
    sqlite3DropTriggerPtr(pParse,pTrigger);
  }
  if ((pTab->tabFlags & 8) != 0) {
    sqlite3NestedParse(pParse,"DELETE FROM %Q.sqlite_sequence WHERE name=%Q",pDVar3[iDb].zDbSName,
                       pTab->zName);
  }
  sqlite3NestedParse(pParse,"DELETE FROM %Q.%s WHERE tbl_name=%Q and type!=\'trigger\'",
                     pDVar3[iDb].zDbSName);
  if ((isView == 0) && (pTab->nModuleArg == 0)) {
    iVar6 = pTab->tnum;
    iVar10 = 0;
    do {
      iTable = 0;
      if (iVar6 < iVar10) {
        iTable = iVar6;
      }
      if (iVar10 == 0) {
        iTable = iVar6;
      }
      for (pIVar8 = pTab->pIndex; pIVar8 != (Index *)0x0; pIVar8 = pIVar8->pNext) {
        iVar2 = pIVar8->tnum;
        iVar11 = iTable;
        if (iTable < iVar2) {
          iVar11 = iVar2;
        }
        if (iVar2 < iVar10) {
          iTable = iVar11;
        }
        if (iVar10 == 0) {
          iTable = iVar11;
        }
      }
      if (iTable != 0) {
        if (pTab->pSchema == (Schema *)0x0) {
          iVar10 = -1000000;
        }
        else {
          iVar10 = -1;
          ppSVar9 = &pParse->db->aDb->pSchema;
          do {
            iVar10 = iVar10 + 1;
            pSVar4 = *ppSVar9;
            ppSVar9 = ppSVar9 + 4;
          } while (pSVar4 != pTab->pSchema);
        }
        destroyRootPage(pParse,iTable,iVar10);
        iVar10 = iTable;
      }
    } while (iTable != 0);
  }
  if (pTab->nModuleArg != 0) {
    pcVar5 = pTab->zName;
    iVar6 = sqlite3VdbeAddOp3(p,0xa2,iDb,0,0);
    sqlite3VdbeChangeP4(p,iVar6,pcVar5,0);
    pPVar7 = pParse->pToplevel;
    if (pParse->pToplevel == (Parse *)0x0) {
      pPVar7 = pParse;
    }
    pPVar7->mayAbort = '\x01';
  }
  pcVar5 = pTab->zName;
  iVar6 = sqlite3VdbeAddOp3(p,0x8f,iDb,0,0);
  sqlite3VdbeChangeP4(p,iVar6,pcVar5,0);
  sqlite3VdbeAddOp3(pParse->pVdbe,0x5f,iDb,1,(pParse->db->aDb[iDb].pSchema)->schema_cookie + 1);
  pSVar4 = db->aDb[iDb].pSchema;
  if ((pSVar4->schemaFlags & 2) != 0) {
    for (pHVar12 = (pSVar4->tblHash).first; pHVar12 != (HashElem *)0x0; pHVar12 = pHVar12->next) {
      pTable = (Table *)pHVar12->data;
      if (pTable->pSelect != (Select *)0x0) {
        sqlite3DeleteColumnNames(db,pTable);
        pTable->aCol = (Column *)0x0;
        pTable->nCol = 0;
      }
    }
    puVar1 = &(db->aDb[iDb].pSchema)->schemaFlags;
    *puVar1 = *puVar1 & 0xfffd;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeDropTable(Parse *pParse, Table *pTab, int iDb, int isView){
  Vdbe *v;
  sqlite3 *db = pParse->db;
  Trigger *pTrigger;
  Db *pDb = &db->aDb[iDb];

  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );
  sqlite3BeginWriteOperation(pParse, 1, iDb);

#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    sqlite3VdbeAddOp0(v, OP_VBegin);
  }
#endif

  /* Drop all triggers associated with the table being dropped. Code
  ** is generated to remove entries from sqlite_master and/or
  ** sqlite_temp_master if required.
  */
  pTrigger = sqlite3TriggerList(pParse, pTab);
  while( pTrigger ){
    assert( pTrigger->pSchema==pTab->pSchema || 
        pTrigger->pSchema==db->aDb[1].pSchema );
    sqlite3DropTriggerPtr(pParse, pTrigger);
    pTrigger = pTrigger->pNext;
  }

#ifndef SQLITE_OMIT_AUTOINCREMENT
  /* Remove any entries of the sqlite_sequence table associated with
  ** the table being dropped. This is done before the table is dropped
  ** at the btree level, in case the sqlite_sequence table needs to
  ** move as a result of the drop (can happen in auto-vacuum mode).
  */
  if( pTab->tabFlags & TF_Autoincrement ){
    sqlite3NestedParse(pParse,
      "DELETE FROM %Q.sqlite_sequence WHERE name=%Q",
      pDb->zDbSName, pTab->zName
    );
  }
#endif

  /* Drop all SQLITE_MASTER table and index entries that refer to the
  ** table. The program name loops through the master table and deletes
  ** every row that refers to a table of the same name as the one being
  ** dropped. Triggers are handled separately because a trigger can be
  ** created in the temp database that refers to a table in another
  ** database.
  */
  sqlite3NestedParse(pParse, 
      "DELETE FROM %Q.%s WHERE tbl_name=%Q and type!='trigger'",
      pDb->zDbSName, MASTER_NAME, pTab->zName);
  if( !isView && !IsVirtual(pTab) ){
    destroyTable(pParse, pTab);
  }

  /* Remove the table entry from SQLite's internal schema and modify
  ** the schema cookie.
  */
  if( IsVirtual(pTab) ){
    sqlite3VdbeAddOp4(v, OP_VDestroy, iDb, 0, 0, pTab->zName, 0);
    sqlite3MayAbort(pParse);
  }
  sqlite3VdbeAddOp4(v, OP_DropTable, iDb, 0, 0, pTab->zName, 0);
  sqlite3ChangeCookie(pParse, iDb);
  sqliteViewResetAll(db, iDb);
}